

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature.c
# Opt level: O3

int main(int argc,char **args)

{
  char *file_name;
  int iVar1;
  void *in_RAX;
  light_pcapng section;
  ulong uVar2;
  float *features;
  void *local_38;
  
  if (1 < argc) {
    uVar2 = 1;
    local_38 = in_RAX;
    do {
      file_name = args[uVar2];
      section = light_read_from_path(file_name);
      if (section == (light_pcapng)0x0) {
        fprintf(_stderr,"Unable to read pcapng: %s\n",file_name);
      }
      else {
        local_38 = (void *)0x0;
        iVar1 = light_section_feature_extraction(section,extractor,&local_38,1,LIGHT_FEATURE_FLOAT);
        if (iVar1 != 0) {
          fprintf(_stderr,"Error while extracting features for %s\n",file_name);
        }
        light_pcapng_release(section);
        free(local_38);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			float *features = NULL;
			int ret = light_section_feature_extraction(pcapng, extractor, (void **)&features, FEATURE_LENGTH, LIGHT_FEATURE_FLOAT);

			if (ret != LIGHT_SUCCESS) {
				fprintf(stderr, "Error while extracting features for %s\n", file);
				goto release;
			}

			// TODO: Print or handle features.
release:
			light_pcapng_release(pcapng);
			free(features);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}